

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16_regexp.cc
# Opt level: O1

RegExp * re2c::UTF16Symbol(rune r)

{
  RegExp *pRVar1;
  RegExp *pRVar2;
  Range *pRVar3;
  RegExp *pRVar4;
  RegExp *local_38;
  
  if (r < 0x10000) {
    pRVar1 = (RegExp *)operator_new(0x10);
    pRVar3 = Range::sym(r);
    pRVar1->_vptr_RegExp = (_func_int **)&PTR__RegExp_0015cd10;
    local_38 = pRVar1;
    std::
    _Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
    ::_M_insert_unique<re2c::RegExp*>
              ((_Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
                *)RegExp::vFreeList,&local_38);
    pRVar1->_vptr_RegExp = (_func_int **)&PTR__RegExp_0015cbf0;
    pRVar1[1]._vptr_RegExp = (_func_int **)pRVar3;
  }
  else {
    pRVar1 = (RegExp *)operator_new(0x18);
    pRVar2 = (RegExp *)operator_new(0x10);
    pRVar3 = Range::sym((r - 0x10000 >> 10) + 0xd800);
    pRVar2->_vptr_RegExp = (_func_int **)&PTR__RegExp_0015cd10;
    local_38 = pRVar2;
    std::
    _Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
    ::_M_insert_unique<re2c::RegExp*>
              ((_Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
                *)RegExp::vFreeList,&local_38);
    pRVar2->_vptr_RegExp = (_func_int **)&PTR__RegExp_0015cbf0;
    pRVar2[1]._vptr_RegExp = (_func_int **)pRVar3;
    pRVar4 = (RegExp *)operator_new(0x10);
    pRVar3 = Range::sym((r & 0x3ff) + 0xdc00);
    pRVar4->_vptr_RegExp = (_func_int **)&PTR__RegExp_0015cd10;
    local_38 = pRVar4;
    std::
    _Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
    ::_M_insert_unique<re2c::RegExp*>
              ((_Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
                *)RegExp::vFreeList,&local_38);
    pRVar4->_vptr_RegExp = (_func_int **)&PTR__RegExp_0015cbf0;
    pRVar4[1]._vptr_RegExp = (_func_int **)pRVar3;
    pRVar1->_vptr_RegExp = (_func_int **)&PTR__RegExp_0015cd10;
    local_38 = pRVar1;
    std::
    _Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
    ::_M_insert_unique<re2c::RegExp*>
              ((_Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
                *)RegExp::vFreeList,&local_38);
    pRVar1->_vptr_RegExp = (_func_int **)&PTR__RegExp_0015cb30;
    pRVar1[1]._vptr_RegExp = (_func_int **)pRVar2;
    pRVar1[2]._vptr_RegExp = (_func_int **)pRVar4;
  }
  return pRVar1;
}

Assistant:

RegExp * UTF16Symbol(utf16::rune r)
{
	if (r <= utf16::MAX_1WORD_RUNE)
		return new MatchOp(Range::sym (r));
	else
	{
		const uint32_t ld = utf16::lead_surr(r);
		const uint32_t tr = utf16::trail_surr(r);
		return new CatOp(new MatchOp(Range::sym (ld)), new MatchOp(Range::sym (tr)));
	}
}